

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcChain.c
# Opt level: O0

Gia_Man_t * Gia_ManDupWithInit(Gia_Man_t *p)

{
  int iVar1;
  int iLit1;
  uint uVar2;
  Gia_Man_t *p_00;
  char *pcVar3;
  Gia_Obj_t *pGVar4;
  bool bVar5;
  int local_24;
  Gia_Obj_t *pGStack_20;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *pNew;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManObjNum(p);
  p_00 = Gia_ManStart(iVar1);
  pcVar3 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar3;
  pcVar3 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar3;
  pGVar4 = Gia_ManConst0(p);
  pGVar4->Value = 0;
  local_24 = 1;
  while( true ) {
    bVar5 = false;
    if (local_24 < p->nObjs) {
      pGStack_20 = Gia_ManObj(p,local_24);
      bVar5 = pGStack_20 != (Gia_Obj_t *)0x0;
    }
    if (!bVar5) break;
    iVar1 = Gia_ObjIsAnd(pGStack_20);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjIsCi(pGStack_20);
      if (iVar1 == 0) {
        iVar1 = Gia_ObjIsCo(pGStack_20);
        if (iVar1 != 0) {
          uVar2 = Gia_ObjFanin0Copy(pGStack_20);
          pGStack_20->Value = uVar2;
          uVar2 = Abc_LitNotCond(pGStack_20->Value,(uint)(*(ulong *)pGStack_20 >> 0x1e) & 1);
          pGStack_20->Value = uVar2;
          uVar2 = Gia_ManAppendCo(p_00,pGStack_20->Value);
          pGStack_20->Value = uVar2;
        }
      }
      else {
        uVar2 = Gia_ManAppendCi(p_00);
        pGStack_20->Value = uVar2;
        uVar2 = Abc_LitNotCond(pGStack_20->Value,(uint)(*(ulong *)pGStack_20 >> 0x1e) & 1);
        pGStack_20->Value = uVar2;
      }
    }
    else {
      iVar1 = Gia_ObjFanin0Copy(pGStack_20);
      iLit1 = Gia_ObjFanin1Copy(pGStack_20);
      uVar2 = Gia_ManAppendAnd(p_00,iVar1,iLit1);
      pGStack_20->Value = uVar2;
    }
    local_24 = local_24 + 1;
  }
  iVar1 = Gia_ManRegNum(p);
  Gia_ManSetRegNum(p_00,iVar1);
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDupWithInit( Gia_Man_t * p )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
            pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else if ( Gia_ObjIsCi(pObj) )
        {
            pObj->Value = Gia_ManAppendCi( pNew );
            pObj->Value = Abc_LitNotCond( pObj->Value, pObj->fMark0 );
        }
        else if ( Gia_ObjIsCo(pObj) )
        {
            pObj->Value = Gia_ObjFanin0Copy(pObj);
            pObj->Value = Abc_LitNotCond( pObj->Value, pObj->fMark0 );
            pObj->Value = Gia_ManAppendCo( pNew, pObj->Value );
        }
    }
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    return pNew;
}